

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

void __thiscall
libcellml::Variable::VariableImpl::setEquivalentConnectionId
          (VariableImpl *this,VariablePtr *equivalentVariable,string *id)

{
  mapped_type *pmVar1;
  VariableWeakPtr weakEquivalentVariable;
  key_type kStack_28;
  
  std::__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2>::
  __weak_ptr<libcellml::Variable,void>
            ((__weak_ptr<libcellml::Variable,(__gnu_cxx::_Lock_policy)2> *)&kStack_28,
             &equivalentVariable->
              super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>);
  pmVar1 = std::
           map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->mConnectionIdMap,&kStack_28);
  std::__cxx11::string::_M_assign((string *)pmVar1);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&kStack_28.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void Variable::VariableImpl::setEquivalentConnectionId(const VariablePtr &equivalentVariable, const std::string &id)
{
    VariableWeakPtr weakEquivalentVariable = equivalentVariable;
    mConnectionIdMap[weakEquivalentVariable] = id;
}